

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSender.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostringstream *poVar1;
  bool bVar2;
  OutputWorker *pOVar3;
  string fileSendName;
  string fileSendPath;
  MyServer server;
  string sStack_2a8;
  string local_288;
  LogStringBuffer local_268;
  MyServer local_e0;
  
  std::__cxx11::string::string((string *)&local_288,"sendfile.bin",(allocator *)&local_268);
  std::__cxx11::string::string((string *)&sStack_2a8,"download.bin",(allocator *)&local_268);
  if (1 < argc) {
    std::__cxx11::string::assign((char *)&local_288);
    if ((int)Logger.ChannelMinLevel < 3) {
      poVar1 = &local_268.LogStream;
      local_268.ChannelName = Logger.ChannelName;
      local_268.LogLevel = Info;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,(string *)&Logger.Prefix);
      std::operator<<((ostream *)poVar1,"Using file send path: ");
      std::operator<<((ostream *)poVar1,(string *)&local_288);
      pOVar3 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar3,&local_268);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    }
    if (argc != 2) {
      std::__cxx11::string::assign((char *)&sStack_2a8);
      if ((int)Logger.ChannelMinLevel < 3) {
        poVar1 = &local_268.LogStream;
        local_268.ChannelName = Logger.ChannelName;
        local_268.LogLevel = Info;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<((ostream *)poVar1,(string *)&Logger.Prefix);
        std::operator<<((ostream *)poVar1,"Using file send name: ");
        std::operator<<((ostream *)poVar1,(string *)&sStack_2a8);
        pOVar3 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar3,&local_268);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      }
    }
  }
  MyServer::MyServer(&local_e0);
  bVar2 = MyServer::Initialize(&local_e0,&local_288,&sStack_2a8);
  if (bVar2) {
    if (1 < (int)Logger.ChannelMinLevel) goto LAB_001040be;
    poVar1 = &local_268.LogStream;
    local_268.ChannelName = Logger.ChannelName;
    local_268.LogLevel = Debug;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,(string *)&Logger.Prefix);
    std::operator<<((ostream *)poVar1,"File sending server started on port ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1,".  Now start the file receiver client to receive a file");
    pOVar3 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar3,&local_268);
  }
  else {
    if (1 < (int)Logger.ChannelMinLevel) goto LAB_001040be;
    poVar1 = &local_268.LogStream;
    local_268.ChannelName = Logger.ChannelName;
    local_268.LogLevel = Debug;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,(string *)&Logger.Prefix);
    std::operator<<((ostream *)poVar1,"File sending server failed to start");
    pOVar3 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar3,&local_268);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_268.LogStream);
  if ((int)Logger.ChannelMinLevel < 2) {
    poVar1 = &local_268.LogStream;
    local_268.ChannelName = Logger.ChannelName;
    local_268.LogLevel = Debug;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,(string *)&Logger.Prefix);
    std::operator<<((ostream *)poVar1,"Press ENTER key to stop the server.");
    pOVar3 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar3,&local_268);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  }
LAB_001040be:
  getchar();
  MyServer::~MyServer(&local_e0);
  if ((int)Logger.ChannelMinLevel < 2) {
    poVar1 = &local_268.LogStream;
    local_268.ChannelName = Logger.ChannelName;
    local_268.LogLevel = Debug;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,(string *)&Logger.Prefix);
    std::operator<<((ostream *)poVar1,"Press ENTER key to terminate.");
    pOVar3 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar3,&local_268);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  }
  getchar();
  if ((int)Logger.ChannelMinLevel < 2) {
    poVar1 = &local_268.LogStream;
    local_268.ChannelName = Logger.ChannelName;
    local_268.LogLevel = Debug;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,(string *)&Logger.Prefix);
    std::operator<<((ostream *)poVar1,"...Key press detected.  Terminating..");
    pOVar3 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar3,&local_268);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  }
  std::__cxx11::string::~string((string *)&sStack_2a8);
  std::__cxx11::string::~string((string *)&local_288);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    std::string fileSendPath = kFileSendPath, fileSendName = kFileSendName;

    if (argc >= 2) {
        fileSendPath = argv[1];
        Logger.Info("Using file send path: ", fileSendPath);
    }
    if (argc >= 3) {
        fileSendName = argv[2];
        Logger.Info("Using file send name: ", fileSendName);
    }

    {
        MyServer server;

        if (server.Initialize(fileSendPath, fileSendName)) {
            Logger.Debug("File sending server started on port ", kFileSenderServerPort,
                ".  Now start the file receiver client to receive a file");
        }
        else {
            Logger.Debug("File sending server failed to start");
        }

        Logger.Debug("Press ENTER key to stop the server.");

        ::getchar();
    }

    Logger.Debug("Press ENTER key to terminate.");

    ::getchar();

    Logger.Debug("...Key press detected.  Terminating..");

    return 0;
}